

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float>::gemm<3,2>
          (tinyBLAS_Q0_AVX<block_q5_0,block_q8_0,float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [32];
  bool bVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  __m128i x;
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  __m256 Cv [2] [3];
  float local_140 [68];
  
  auVar21 = _DAT_0016a9c0;
  lVar13 = (n - n0) / 2;
  lVar19 = ((m - m0) / 3) * lVar13;
  lVar14 = (lVar19 + -1 + (long)*(int *)(this + 0x3c)) / (long)*(int *)(this + 0x3c);
  lVar17 = *(int *)(this + 0x38) * lVar14;
  lVar14 = lVar14 + lVar17;
  if (lVar19 <= lVar14) {
    lVar14 = lVar19;
  }
  if (lVar17 < lVar14) {
    lVar19 = *(long *)this;
    lVar5 = *(long *)(this + 8);
    auVar22._8_8_ = 0x7fbfdfeff7fbfdfe;
    auVar22._0_8_ = 0x7fbfdfeff7fbfdfe;
    auVar22._16_8_ = 0x7fbfdfeff7fbfdfe;
    auVar22._24_8_ = 0x7fbfdfeff7fbfdfe;
    auVar23._8_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar23._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar23._16_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar23._24_8_ = 0xf0f0f0f0f0f0f0f0;
    lVar6 = *(long *)(this + 0x18);
    lVar7 = *(long *)(this + 0x28);
    auVar11 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    lVar8 = *(long *)(this + 0x10);
    lVar9 = *(long *)(this + 0x20);
    lVar10 = *(long *)(this + 0x30);
    do {
      local_140[0x20] = 0.0;
      local_140[0x21] = 0.0;
      local_140[0x22] = 0.0;
      local_140[0x23] = 0.0;
      local_140[0x24] = 0.0;
      local_140[0x25] = 0.0;
      local_140[0x26] = 0.0;
      local_140[0x27] = 0.0;
      local_140[0x28] = 0.0;
      local_140[0x29] = 0.0;
      local_140[0x2a] = 0.0;
      local_140[0x2b] = 0.0;
      local_140[0x2c] = 0.0;
      local_140[0x2d] = 0.0;
      local_140[0x2e] = 0.0;
      local_140[0x2f] = 0.0;
      local_140[0x10] = 0.0;
      local_140[0x11] = 0.0;
      local_140[0x12] = 0.0;
      local_140[0x13] = 0.0;
      local_140[0x14] = 0.0;
      local_140[0x15] = 0.0;
      local_140[0x16] = 0.0;
      local_140[0x17] = 0.0;
      local_140[0x18] = 0.0;
      local_140[0x19] = 0.0;
      local_140[0x1a] = 0.0;
      local_140[0x1b] = 0.0;
      local_140[0x1c] = 0.0;
      local_140[0x1d] = 0.0;
      local_140[0x1e] = 0.0;
      local_140[0x1f] = 0.0;
      local_140[0] = 0.0;
      local_140[1] = 0.0;
      local_140[2] = 0.0;
      local_140[3] = 0.0;
      local_140[4] = 0.0;
      local_140[5] = 0.0;
      local_140[6] = 0.0;
      local_140[7] = 0.0;
      local_140[8] = 0.0;
      local_140[9] = 0.0;
      local_140[10] = 0.0;
      local_140[0xb] = 0.0;
      local_140[0xc] = 0.0;
      local_140[0xd] = 0.0;
      local_140[0xe] = 0.0;
      local_140[0xf] = 0.0;
      lVar15 = (lVar17 / lVar13) * 3 + m0;
      lVar1 = n0 + (lVar17 % lVar13) * 2;
      if (0 < lVar6) {
        lVar19 = lVar9 * 0x16 * lVar15 + lVar19;
        auVar4 = *(undefined1 (*) [16])(lVar19 + 6);
        auVar26 = vpsrlw_avx(auVar4,4);
        auVar25._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar4;
        auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
        auVar21 = vpermb_avx512vl(auVar21,ZEXT432(*(uint *)(lVar19 + 2)));
        auVar21 = vpor_avx2(auVar21,auVar22);
        auVar21 = vpcmpeqb_avx2(auVar21,auVar11);
        auVar21 = vpternlogq_avx512vl(auVar21,auVar21,auVar21,0xf);
        auVar21 = vpternlogq_avx512vl(auVar21,auVar25,auVar23,0xe4);
        vpsignb_avx2(auVar21,auVar21);
        vpsignb_avx2(*(undefined1 (*) [32])(lVar5 + 2 + lVar1 * lVar7 * 0x22),auVar21);
        halt_baddata();
      }
      lVar18 = 0;
      bVar12 = true;
      do {
        bVar16 = bVar12;
        lVar20 = 0;
        do {
          pfVar3 = local_140 + lVar18 * 0x18 + lVar20 * 2 + 4;
          pfVar2 = local_140 + lVar18 * 0x18 + lVar20 * 2;
          auVar26._0_4_ = *pfVar3 + *pfVar2;
          auVar26._4_4_ = pfVar3[1] + pfVar2[1];
          auVar26._8_4_ = pfVar3[2] + pfVar2[2];
          auVar26._12_4_ = pfVar3[3] + pfVar2[3];
          auVar4 = vshufpd_avx(auVar26,auVar26,1);
          auVar24._0_4_ = auVar26._0_4_ + auVar4._0_4_;
          auVar24._4_4_ = auVar26._4_4_ + auVar4._4_4_;
          auVar24._8_4_ = auVar26._8_4_ + auVar4._8_4_;
          auVar24._12_4_ = auVar26._12_4_ + auVar4._12_4_;
          auVar4 = vhaddps_avx(auVar24,auVar24);
          *(int *)(lVar8 + lVar15 * 4 + (lVar18 + lVar1) * lVar10 * 4 + lVar20) = auVar4._0_4_;
          lVar20 = lVar20 + 4;
        } while (lVar20 != 0xc);
        lVar18 = 1;
        bVar12 = false;
      } while (bVar16);
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar14);
  }
  return;
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }